

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O0

QString * __thiscall QDateTimeParser::sectionText(QDateTimeParser *this,int sectionIndex)

{
  long *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  SectionNode *sn;
  undefined8 in_stack_ffffffffffffffa8;
  undefined1 *puVar1;
  QDateTimeParser *in_stack_ffffffffffffffb0;
  QDateTimeParser *in_stack_ffffffffffffffb8;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sectionNode(in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  puVar1 = local_20;
  (**(code **)(*in_RSI + 0x10))();
  sectionText(in_stack_ffffffffffffffb8,(QString *)in_stack_ffffffffffffffb0,
              (int)((ulong)puVar1 >> 0x20),(int)puVar1);
  QString::~QString((QString *)0x76bb9d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QDateTimeParser::sectionText(int sectionIndex) const
{
    const SectionNode &sn = sectionNode(sectionIndex);
    return sectionText(displayText(), sectionIndex, sn.pos);
}